

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O2

void crnlib::split_vectors<crnlib::vec<1u,float>>
               (vec<1U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<1U,_float> (*result) [2])

{
  undefined1 auVar1 [16];
  uint i;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint i_3;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  float fVar9;
  double dVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  double dVar18;
  float fVar19;
  float in_XMM11_Da;
  float in_XMM11_Db;
  undefined4 in_XMM11_Dc;
  undefined4 in_XMM11_Dd;
  vec<1U,_float> local_35c;
  undefined1 local_358 [16];
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  vec<1U,_float> weightedVectors [64];
  double weightedDotProducts [64];
  
  uVar6 = (ulong)size;
  dVar18 = 0.0;
  fVar14 = 0.0;
  uVar3 = 0;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    uVar8 = (*weights)[uVar4];
    fVar9 = (float)uVar8;
    fVar15 = (*vectors)[uVar4].m_s[0];
    fVar19 = fVar15 * fVar9;
    weightedVectors[uVar4].m_s[0] = fVar19;
    fVar14 = fVar14 + fVar19;
    uVar3 = uVar3 + uVar8;
    dVar10 = (double)(fVar15 * fVar15 * fVar9);
    weightedDotProducts[uVar4] = dVar10;
    dVar18 = dVar18 + dVar10;
  }
  fVar15 = (float)uVar3;
  fVar9 = (1.0 / fVar15) * fVar14;
  (*result)[1].m_s[0] = fVar9;
  (*result)[0].m_s[0] = fVar9;
  if ((size != 1) &&
     (auVar16 = ZEXT816(0), 0.0 < (float)(dVar18 - (double)((fVar14 * fVar14) / fVar15)))) {
    uVar12 = 0;
    uVar13 = 0xbff00000;
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      fVar14 = (*vectors)[uVar3].m_s[0];
      auVar16 = ZEXT416((uint)fVar14);
      fVar14 = fVar14 - fVar9;
      dVar18 = (double)(fVar14 * fVar14);
      if (dVar18 < (double)CONCAT44(uVar13,uVar12) || dVar18 == (double)CONCAT44(uVar13,uVar12)) {
        auVar16._4_4_ = in_XMM11_Db;
        auVar16._0_4_ = in_XMM11_Da;
        auVar16._8_4_ = in_XMM11_Dc;
        auVar16._12_4_ = in_XMM11_Dd;
      }
      if (dVar18 <= (double)CONCAT44(uVar13,uVar12)) {
        dVar18 = (double)CONCAT44(uVar13,uVar12);
      }
      in_XMM11_Da = auVar16._0_4_;
      in_XMM11_Db = auVar16._4_4_;
      in_XMM11_Dc = auVar16._8_4_;
      in_XMM11_Dd = auVar16._12_4_;
      uVar12 = SUB84(dVar18,0);
      uVar13 = (undefined4)((ulong)dVar18 >> 0x20);
    }
    uVar12 = 0;
    uVar13 = 0xbff00000;
    uVar3 = 0;
    while( true ) {
      if (uVar6 == uVar3) break;
      fVar14 = (*vectors)[uVar3].m_s[0];
      fVar19 = fVar14 - in_XMM11_Da;
      dVar18 = (double)(fVar19 * fVar19);
      auVar1 = ZEXT416((uint)fVar14);
      if (dVar18 < (double)CONCAT44(uVar13,uVar12) || dVar18 == (double)CONCAT44(uVar13,uVar12)) {
        auVar1 = auVar16;
      }
      auVar16 = auVar1;
      if (dVar18 <= (double)CONCAT44(uVar13,uVar12)) {
        dVar18 = (double)CONCAT44(uVar13,uVar12);
      }
      uVar3 = uVar3 + 1;
      uVar12 = SUB84(dVar18,0);
      uVar13 = (undefined4)((ulong)dVar18 >> 0x20);
    }
    local_348 = (in_XMM11_Da + fVar9) * 0.5;
    fStack_344 = (auVar16._0_4_ + fVar9) * 0.5;
    fStack_340 = (in_XMM11_Db + fVar9) * 0.0;
    fStack_33c = (auVar16._4_4_ + fVar9) * 0.0;
    if (2 < size) {
      fVar14 = 0.0;
      for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
        fVar19 = (*vectors)[uVar3].m_s[0] - fVar9;
        fVar14 = fVar14 + (float)(*weights)[uVar3] * fVar19 * fVar19;
      }
      iVar2 = 10;
      local_35c.m_s[0] = (float  [1])1.0;
      while (bVar7 = iVar2 != 0, iVar2 = iVar2 + -1, bVar7) {
        fVar17 = (float)local_35c.m_s[0] * (fVar14 / fVar15);
        fVar19 = fVar17 + 0.0;
        uVar8 = -(uint)(fVar17 != 0.0);
        local_35c.m_s[0] =
             (float  [1])(uVar8 & (uint)((1.0 / fVar19) * fVar19) | ~uVar8 & (uint)fVar19);
      }
      uVar3 = 0;
      local_358 = ZEXT416((uint)fVar9);
      vec<1U,_float>::normalize(&local_35c,(vec<1U,_float> *)0x0);
      dVar18 = 0.0;
      dVar10 = 0.0;
      uVar11 = 0;
      while( true ) {
        fVar14 = (float)uVar11;
        fVar15 = (float)((ulong)uVar11 >> 0x20);
        if (uVar6 == uVar3) break;
        if (0.0 <= ((*vectors)[uVar3].m_s[0] - (float)local_358._0_4_) * (float)local_35c.m_s[0]) {
          dVar10 = dVar10 + (double)(*weights)[uVar3];
          uVar11 = CONCAT44(fVar15 + weightedVectors[uVar3].m_s[0],fVar14);
        }
        else {
          uVar11 = CONCAT44(fVar15,fVar14 + weightedVectors[uVar3].m_s[0]);
          dVar18 = dVar18 + (double)(*weights)[uVar3];
        }
        uVar3 = uVar3 + 1;
      }
      if (0.0 < dVar18 && 0.0 < dVar10) {
        auVar1._8_4_ = SUB84(dVar10,0);
        auVar1._0_8_ = dVar18;
        auVar1._12_4_ = (int)((ulong)dVar10 >> 0x20);
        auVar16 = divpd(_DAT_00195590,auVar1);
        local_348 = fVar14 * (float)auVar16._0_8_;
        fStack_344 = fVar15 * (float)auVar16._8_8_;
      }
    }
    iVar2 = 0;
    fVar14 = 1e+10;
    while (iVar2 != 0x400) {
      dVar18 = 0.0;
      fVar15 = 0.0;
      fVar9 = 0.0;
      uVar4 = 0;
      uVar3 = 0;
      dVar10 = 0.0;
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        fVar19 = (*vectors)[uVar5].m_s[0];
        fVar17 = local_348 - fVar19;
        fVar19 = fStack_344 - fVar19;
        if (fVar19 * fVar19 <= fVar17 * fVar17) {
          fVar9 = fVar9 + weightedVectors[uVar5].m_s[0];
          dVar10 = dVar10 + weightedDotProducts[uVar5];
          uVar3 = uVar3 + (*weights)[uVar5];
        }
        else {
          fVar15 = fVar15 + weightedVectors[uVar5].m_s[0];
          dVar18 = dVar18 + weightedDotProducts[uVar5];
          uVar4 = uVar4 + (*weights)[uVar5];
        }
      }
      if (uVar4 == 0) {
        return;
      }
      if (uVar3 == 0) {
        return;
      }
      fVar19 = (float)(dVar10 - (double)((fVar9 * fVar9) / (float)uVar3)) +
               (float)(dVar18 - (double)((fVar15 * fVar15) / (float)uVar4));
      local_348 = (1.0 / (float)uVar4) * fVar15;
      fStack_344 = (1.0 / (float)uVar3) * fVar9;
      if ((fVar19 < 1e-05) ||
         (fVar15 = fVar14 - fVar19, iVar2 = iVar2 + 1, fVar14 = fVar19, fVar15 / fVar19 < 1e-05))
      break;
    }
    (*result)[0].m_s[0] = local_348;
    (*result)[1].m_s[0] = fStack_344;
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2]) {
  VectorType weightedVectors[64];
  double weightedDotProducts[64];
  VectorType centroid(cClear);
  uint64 total_weight = 0;
  double ttsum = 0.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    const uint weight = weights[i];
    weightedVectors[i] = v * (float)weight;
    centroid += weightedVectors[i];
    total_weight += weight;
    weightedDotProducts[i] = v.dot(v) * weight;
    ttsum += weightedDotProducts[i];
  }
  float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
  centroid *= (1.0f / total_weight);
  result[0] = result[1] = centroid;
  if (variance <= 0.0f || size == 1)
    return;
  VectorType furthest;
  double furthest_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(centroid);
    if (dist > furthest_dist) {
      furthest_dist = dist;
      furthest = v;
    }
  }
  VectorType opposite;
  double opposite_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(furthest);
    if (dist > opposite_dist) {
      opposite_dist = dist;
      opposite = v;
    }
  }
  VectorType left_child((furthest + centroid) * .5f);
  VectorType right_child((opposite + centroid) * .5f);
  if (size > 2) {
    const uint N = VectorType::num_elements;
    matrix<N, N, float> covar;
    covar.clear();
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i] - centroid;
      const VectorType w = v * (float)weights[i];
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
      }
    }
    float divider = (float)total_weight;
    for (uint x = 0; x < N; x++) {
      for (uint y = x; y < N; y++) {
        covar[x][y] /= divider;
        covar[y][x] = covar[x][y];
      }
    }
    VectorType axis(1.0f);
    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;
      double max_sum = 0;
      for (uint i = 0; i < N; i++) {
        double sum = 0;
        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];
        x[i] = (float)sum;
        max_sum = i ? math::maximum(max_sum, sum) : sum;
      }
      if (max_sum != 0.0f)
        x *= (float)(1.0f / max_sum);
      axis = x;
    }
    axis.normalize();
    VectorType new_left_child(0.0f);
    VectorType new_right_child(0.0f);
    double left_weight = 0.0f;
    double right_weight = 0.0f;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      const float weight = (float)weights[i];
      double t = (v - centroid) * axis;
      if (t < 0.0f) {
        new_left_child += weightedVectors[i];
        left_weight += weight;
      } else {
        new_right_child += weightedVectors[i];
        right_weight += weight;
      }
    }
    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child = new_left_child * (float)(1.0f / left_weight);
      right_child = new_right_child * (float)(1.0f / right_weight);
    }
  }
  uint64 left_weight = 0;
  uint64 right_weight = 0;
  float prev_total_variance = 1e+10f;
  float left_variance = 0.0f;
  float right_variance = 0.0f;
  const uint cMaxLoops = 1024;
  for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
    VectorType new_left_child(cClear);
    VectorType new_right_child(cClear);
    double left_ttsum = 0.0f;
    double right_ttsum = 0.0f;
    left_weight = 0;
    right_weight = 0;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      if (left_dist2 < right_dist2) {
        new_left_child += weightedVectors[i];
        left_ttsum += weightedDotProducts[i];
        left_weight += weights[i];
      } else {
        new_right_child += weightedVectors[i];
        right_ttsum += weightedDotProducts[i];
        right_weight += weights[i];
      }
    }
    if ((!left_weight) || (!right_weight))
      return;
    left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
    right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
    new_left_child *= (1.0f / left_weight);
    new_right_child *= (1.0f / right_weight);
    left_child = new_left_child;
    right_child = new_right_child;
    float total_variance = left_variance + right_variance;
    if (total_variance < .00001f)
      break;
    if (((prev_total_variance - total_variance) / total_variance) < .00001f)
      break;
    prev_total_variance = total_variance;
  }
  result[0] = left_child;
  result[1] = right_child;
}